

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O1

int __thiscall sf::priv::JoystickImpl::open(JoystickImpl *this,char *__file,int __oflag,...)

{
  undefined1 *puVar1;
  long lVar2;
  undefined3 uVar3;
  undefined5 uVar4;
  int __fd;
  int __fd_00;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  char *__s;
  int *piVar8;
  long *plVar9;
  udev_device *puVar10;
  long *extraout_RAX;
  ostream *poVar11;
  ulong uVar12;
  ulong uVar13;
  string devnode_1;
  char name [128];
  string devnode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  long *local_118;
  long local_110;
  long local_108 [2];
  undefined1 local_f8 [35];
  undefined5 uStack_d5;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  long *local_70;
  long local_68;
  long local_60 [2];
  String local_50;
  
  uVar12 = (ulong)__file & 0xffffffff;
  uVar13 = (DAT_0022e880 - (anonymous_namespace)::joystickList >> 3) * -0x71c71c71c71c71c7;
  if (uVar13 < uVar12 || uVar13 - uVar12 == 0) {
    return 0;
  }
  if (*(char *)((anonymous_namespace)::joystickList + 0x40 + uVar12 * 0x48) != '\x01') {
    return 0;
  }
  plVar9 = (long *)((anonymous_namespace)::joystickList + uVar12 * 0x48);
  local_70 = local_60;
  lVar2 = *plVar9;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,lVar2,plVar9[1] + lVar2);
  __fd = ::open((char *)local_70,0x800);
  this->m_file = __fd;
  if (__fd < 0) {
    poVar11 = err();
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Failed to open joystick ",0x18);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
    piVar8 = __errno_location();
    plVar9 = (long *)std::ostream::operator<<(poVar11,*piVar8);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    goto LAB_00121793;
  }
  ioctl(__fd,0x80406a32,this->m_mapping);
  local_118 = local_108;
  lVar2 = *(long *)((anonymous_namespace)::joystickList + uVar12 * 0x48);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,lVar2,
             *(long *)((anonymous_namespace)::joystickList + 8 + uVar12 * 0x48) + lVar2);
  __fd_00 = ::open((char *)local_118,0x800);
  if (__fd_00 < 0) {
LAB_00121254:
    if (((anonymous_namespace)::udevContext != 0) &&
       (puVar10 = (udev_device *)
                  udev_device_new_from_syspath
                            ((anonymous_namespace)::udevContext,
                             *(undefined8 *)
                              ((anonymous_namespace)::joystickList + 0x20 + uVar12 * 0x48)),
       puVar10 != (udev_device *)0x0)) {
      puVar1 = local_f8 + 0x10;
      local_f8._0_3_ = SUB83(puVar1,0);
      local_f8._3_5_ = (undefined5)((ulong)puVar1 >> 0x18);
      local_f8._16_4_ = 0x646f7270;
      local_f8._8_3_ = 7;
      local_f8._11_5_ = 0;
      local_f8._20_4_ = 0x746375;
      __s = anon_unknown.dwarf_abca6::getUsbAttribute(puVar10,(string *)local_f8);
      if ((undefined1 *)CONCAT53(local_f8._3_5_,local_f8._0_3_) != puVar1) {
        operator_delete((undefined1 *)CONCAT53(local_f8._3_5_,local_f8._0_3_),
                        CONCAT44(local_f8._20_4_,local_f8._16_4_) + 1);
      }
      udev_device_unref(puVar10);
      if (__s != (char *)0x0) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        sVar7 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,__s,__s + sVar7);
        goto LAB_00121428;
      }
    }
    poVar11 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"Unable to get name for joystick ",0x20);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_118,local_110);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_f8._0_3_ = 0x10;
    local_f8._3_5_ = 0;
    local_138._M_dataplus._M_p =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   (&local_138,(size_type *)local_f8,0);
    local_138._M_string_length = CONCAT53(local_f8._3_5_,local_f8._0_3_);
    *(undefined8 *)local_138._M_dataplus._M_p = 0x206e776f6e6b6e55;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 8) = 'J';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 9) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 10) = 'y';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xb) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xc) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xd) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xe) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xf) = 'k';
    local_138._M_dataplus._M_p[local_138._M_string_length] = '\0';
    local_138.field_2._M_allocated_capacity = local_138._M_string_length;
  }
  else {
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    uStack_d5 = 0;
    uStack_d0 = 0;
    local_f8._16_4_ = 0;
    local_f8._20_4_ = 0;
    local_f8[0x18] = '\0';
    local_f8[0x19] = '\0';
    local_f8[0x1a] = '\0';
    local_f8[0x1b] = '\0';
    local_f8[0x1c] = '\0';
    local_f8._29_2_ = 0;
    local_f8._31_4_ = 0;
    local_f8._0_3_ = 0;
    local_f8._3_5_ = 0;
    local_f8._8_3_ = 0;
    local_f8._11_5_ = 0;
    iVar5 = ioctl(__fd_00,0x80806a13);
    ::close(__fd_00);
    if (iVar5 < 0) goto LAB_00121254;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    sVar7 = strlen(local_f8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,local_f8,local_f8 + sVar7);
  }
LAB_00121428:
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  std::locale::locale((locale *)local_f8);
  String::String(&local_50,&local_138,(locale *)local_f8);
  String::operator=(&(this->m_identification).name,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_50.m_string._M_dataplus._M_p != &local_50.m_string.field_2) {
    operator_delete(local_50.m_string._M_dataplus._M_p,
                    local_50.m_string.field_2._M_allocated_capacity * 4 + 4);
  }
  std::locale::~locale((locale *)local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anonymous_namespace)::udevContext != 0) {
    puVar10 = (udev_device *)
              udev_device_new_from_syspath
                        ((anonymous_namespace)::udevContext,
                         *(undefined8 *)((anonymous_namespace)::joystickList + 0x20 + uVar12 * 0x48)
                        );
    if (puVar10 == (udev_device *)0x0) {
      poVar11 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"Failed to get vendor ID of joystick ",0x24);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,*(char **)((anonymous_namespace)::joystickList + uVar12 * 0x48),
                           *(long *)((anonymous_namespace)::joystickList + 8 + uVar12 * 0x48));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
LAB_0012159e:
      std::ostream::put((char)poVar11);
      uVar6 = 0;
      std::ostream::flush();
    }
    else {
      puVar1 = local_f8 + 0x10;
      local_f8._0_3_ = SUB83(puVar1,0);
      uVar3 = local_f8._0_3_;
      local_f8._3_5_ = (undefined5)((ulong)puVar1 >> 0x18);
      uVar4 = local_f8._3_5_;
      local_f8._16_4_ = 0x565f4449;
      local_f8._20_4_ = 0x4f444e45;
      local_f8[0x18] = 'R';
      local_f8[0x19] = '_';
      local_f8[0x1a] = 'I';
      local_f8[0x1b] = 'D';
      local_f8._8_3_ = 0xc;
      local_f8._11_5_ = 0;
      local_f8[0x1c] = '\0';
      uVar6 = anon_unknown.dwarf_abca6::getUdevAttributeUint(puVar10,(string *)local_f8);
      if ((undefined1 *)CONCAT53(local_f8._3_5_,local_f8._0_3_) != puVar1) {
        operator_delete((undefined1 *)CONCAT53(local_f8._3_5_,local_f8._0_3_),
                        CONCAT44(local_f8._20_4_,local_f8._16_4_) + 1);
      }
      if (uVar6 == 0) {
        local_f8._16_4_ = 0x65566469;
        local_f8._20_4_ = 0x726f646e;
        local_f8._8_3_ = 8;
        local_f8._11_5_ = 0;
        local_f8[0x18] = '\0';
        local_f8._0_3_ = uVar3;
        local_f8._3_5_ = uVar4;
        uVar6 = anon_unknown.dwarf_abca6::getUsbAttributeUint(puVar10,(string *)local_f8);
        if ((undefined1 *)CONCAT53(local_f8._3_5_,local_f8._0_3_) != puVar1) {
          operator_delete((undefined1 *)CONCAT53(local_f8._3_5_,local_f8._0_3_),
                          CONCAT44(local_f8._20_4_,local_f8._16_4_) + 1);
        }
        udev_device_unref(puVar10);
        if (uVar6 == 0) {
          poVar11 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"Failed to get vendor ID of joystick ",0x24);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,*(char **)((anonymous_namespace)::joystickList +
                                                 uVar12 * 0x48),
                               *(long *)((anonymous_namespace)::joystickList + 8 + uVar12 * 0x48));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          goto LAB_0012159e;
        }
      }
      else {
        udev_device_unref(puVar10);
      }
    }
    (this->m_identification).vendorId = uVar6;
    if ((anonymous_namespace)::udevContext == 0) {
      poVar11 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"Failed to get product ID of joystick ",0x25);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,*(char **)((anonymous_namespace)::joystickList + uVar12 * 0x48),
                           *(long *)((anonymous_namespace)::joystickList + 8 + uVar12 * 0x48));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
LAB_0012173f:
      std::ostream::put((char)poVar11);
      uVar6 = 0;
      std::ostream::flush();
    }
    else {
      puVar10 = (udev_device *)
                udev_device_new_from_syspath
                          ((anonymous_namespace)::udevContext,
                           *(undefined8 *)
                            ((anonymous_namespace)::joystickList + 0x20 + uVar12 * 0x48));
      if (puVar10 == (udev_device *)0x0) {
        poVar11 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"Failed to get product ID of joystick ",0x25);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,*(char **)((anonymous_namespace)::joystickList + uVar12 * 0x48)
                             ,*(long *)((anonymous_namespace)::joystickList + 8 + uVar12 * 0x48));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        goto LAB_0012173f;
      }
      puVar1 = local_f8 + 0x10;
      local_f8._0_3_ = SUB83(puVar1,0);
      uVar3 = local_f8._0_3_;
      local_f8._3_5_ = (undefined5)((ulong)puVar1 >> 0x18);
      uVar4 = local_f8._3_5_;
      local_f8._16_4_ = 0x4d5f4449;
      local_f8._20_4_ = 0x4c45444f;
      local_f8[0x18] = '_';
      local_f8[0x19] = 'I';
      local_f8[0x1a] = 'D';
      local_f8._8_3_ = 0xb;
      local_f8._11_5_ = 0;
      local_f8[0x1b] = '\0';
      uVar6 = anon_unknown.dwarf_abca6::getUdevAttributeUint(puVar10,(string *)local_f8);
      if ((undefined1 *)CONCAT53(local_f8._3_5_,local_f8._0_3_) != puVar1) {
        operator_delete((undefined1 *)CONCAT53(local_f8._3_5_,local_f8._0_3_),
                        CONCAT44(local_f8._20_4_,local_f8._16_4_) + 1);
      }
      if (uVar6 == 0) {
        local_f8._16_4_ = 0x72506469;
        local_f8._20_4_ = 0x6375646f;
        local_f8[0x18] = 't';
        local_f8[0x19] = '\0';
        local_f8._8_3_ = 9;
        local_f8._11_5_ = 0;
        local_f8._0_3_ = uVar3;
        local_f8._3_5_ = uVar4;
        uVar6 = anon_unknown.dwarf_abca6::getUsbAttributeUint(puVar10,(string *)local_f8);
        if ((undefined1 *)CONCAT53(local_f8._3_5_,local_f8._0_3_) != puVar1) {
          operator_delete((undefined1 *)CONCAT53(local_f8._3_5_,local_f8._0_3_),
                          CONCAT44(local_f8._20_4_,local_f8._16_4_) + 1);
        }
        udev_device_unref(puVar10);
        if (uVar6 == 0) {
          poVar11 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"Failed to get product ID of joystick ",0x25);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,*(char **)((anonymous_namespace)::joystickList +
                                                 uVar12 * 0x48),
                               *(long *)((anonymous_namespace)::joystickList + 8 + uVar12 * 0x48));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          goto LAB_0012173f;
        }
      }
      else {
        udev_device_unref(puVar10);
      }
    }
    (this->m_identification).productId = uVar6;
  }
  local_f8._20_4_ = 0;
  local_f8[0x18] = '\0';
  local_f8[0x19] = '\0';
  local_f8[0x1a] = '\0';
  local_f8[0x1b] = '\0';
  local_f8[0x1c] = '\0';
  local_f8._29_2_ = 0;
  local_f8._31_4_ = 0;
  local_f8._3_5_ = 0;
  local_f8._8_3_ = 0;
  local_f8._11_5_ = 0;
  local_f8._16_4_ = 0;
  (this->m_state).connected = false;
  *(ulong *)&(this->m_state).field_0x1 = (ulong)(uint3)local_f8._0_3_;
  *(undefined8 *)((long)(this->m_state).axes + 5) = 0;
  *(undefined8 *)((long)(this->m_state).axes + 0xd) = 0;
  *(undefined8 *)((long)(this->m_state).axes + 0x15) = 0;
  (this->m_state).axes[7] = 0.0;
  (this->m_state).buttons[0] = false;
  (this->m_state).buttons[1] = false;
  (this->m_state).buttons[2] = false;
  (this->m_state).buttons[3] = false;
  (this->m_state).buttons[4] = false;
  (this->m_state).buttons[5] = false;
  (this->m_state).buttons[6] = false;
  (this->m_state).buttons[7] = false;
  (this->m_state).buttons[8] = false;
  (this->m_state).buttons[9] = false;
  (this->m_state).buttons[10] = false;
  (this->m_state).buttons[0xb] = false;
  (this->m_state).buttons[0xc] = false;
  (this->m_state).buttons[0xd] = false;
  (this->m_state).buttons[0xe] = false;
  (this->m_state).buttons[0xf] = false;
  (this->m_state).buttons[0x10] = false;
  (this->m_state).buttons[0x11] = false;
  (this->m_state).buttons[0x12] = false;
  (this->m_state).buttons[0x13] = false;
  (this->m_state).buttons[0x14] = false;
  (this->m_state).buttons[0x15] = false;
  (this->m_state).buttons[0x16] = false;
  (this->m_state).buttons[0x17] = false;
  (this->m_state).buttons[0x18] = false;
  (this->m_state).buttons[0x19] = false;
  (this->m_state).buttons[0x1a] = false;
  (this->m_state).buttons[0x1b] = false;
  (this->m_state).buttons[0x1c] = false;
  (this->m_state).buttons[0x1d] = false;
  (this->m_state).buttons[0x1e] = false;
  (this->m_state).buttons[0x1f] = false;
LAB_00121793:
  plVar9 = local_60;
  if (local_70 != plVar9) {
    operator_delete(local_70,local_60[0] + 1);
    plVar9 = extraout_RAX;
  }
  if (__fd < 0) {
    return 0;
  }
  return (int)CONCAT71((int7)((ulong)plVar9 >> 8),1);
}

Assistant:

bool JoystickImpl::open(unsigned int index)
{
    if (index >= joystickList.size())
        return false;

    if (joystickList[index].plugged)
    {
        std::string devnode = joystickList[index].deviceNode;

        // Open the joystick's file descriptor (read-only and non-blocking)
        m_file = ::open(devnode.c_str(), O_RDONLY | O_NONBLOCK);
        if (m_file >= 0)
        {
            // Retrieve the axes mapping
            ioctl(m_file, JSIOCGAXMAP, m_mapping);

            // Get info
            m_identification.name = getJoystickName(index);

            if (udevContext)
            {
                m_identification.vendorId  = getJoystickVendorId(index);
                m_identification.productId = getJoystickProductId(index);
            }

            // Reset the joystick state
            m_state = JoystickState();

            return true;
        }
        else
        {
            err() << "Failed to open joystick " << devnode << ": " << errno << std::endl;
        }
    }

    return false;
}